

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,float coordX,
               int coordY,Vec4 *result)

{
  int size;
  bool bVar1;
  int iVar2;
  int y;
  int c;
  float fVar3;
  float fVar4;
  Vec2 uBounds;
  Vec4 colorB;
  Vec4 colorA;
  float local_a0;
  float local_9c;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  Vec4 local_68;
  Vec4 local_58;
  LookupPrecision *local_40;
  Vec4 *local_38;
  
  local_40 = prec;
  local_38 = result;
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_a0,sampler->normalizedCoords,(level->m_size).m_data[0],coordX
             ,(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  fVar3 = floorf(local_a0 + -0.5);
  fVar4 = floorf(local_9c + -0.5);
  size = (level->m_size).m_data[0];
  getTextureChannelClass((level->m_format).type);
  iVar2 = (int)fVar3;
  do {
    c = iVar2;
    if ((int)fVar4 < c) break;
    iVar2 = TexVerifierUtil::wrap(sampler->wrapS,c,size);
    y = TexVerifierUtil::wrap(sampler->wrapS,c + 1,size);
    local_78 = ZEXT416((uint)(local_a0 + -0.5));
    local_98._16_16_ = ZEXT416((uint)(local_9c + -0.5));
    if ((((iVar2 < 0) || ((level->m_size).m_data[0] <= iVar2)) || (coordY < 0)) ||
       (((level->m_size).m_data[1] <= coordY || ((level->m_size).m_data[2] < 1)))) {
      sampleTextureBorder<float>((tcu *)&local_58,&level->m_format,sampler);
    }
    else {
      ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_98,(int)level,iVar2,coordY);
      bVar1 = isSRGB(level->m_format);
      if (bVar1) {
        sRGBToLinear((tcu *)&local_58,(Vec4 *)local_98);
      }
      else {
        local_58.m_data[1] = (float)local_98._4_4_;
        local_58.m_data[0] = (float)local_98._0_4_;
      }
    }
    if (((y < 0) || ((level->m_size).m_data[0] <= y)) ||
       ((coordY < 0 || (((level->m_size).m_data[1] <= coordY || ((level->m_size).m_data[2] < 1))))))
    {
      sampleTextureBorder<float>((tcu *)&local_68,&level->m_format,sampler);
    }
    else {
      ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_98,(int)level,y,coordY);
      bVar1 = isSRGB(level->m_format);
      if (bVar1) {
        sRGBToLinear((tcu *)&local_68,(Vec4 *)local_98);
      }
      else {
        local_68.m_data[1] = (float)local_98._4_4_;
        local_68.m_data[0] = (float)local_98._0_4_;
      }
    }
    fVar3 = (float)local_78._0_4_ - (float)c;
    local_98._0_4_ = 1.0;
    if (fVar3 <= 1.0) {
      local_98._0_4_ = fVar3;
    }
    local_98._0_4_ = ~-(uint)(fVar3 < 0.0) & local_98._0_4_;
    fVar3 = (float)local_98._16_4_ - (float)c;
    local_98._4_4_ = 1.0;
    if (fVar3 <= 1.0) {
      local_98._4_4_ = fVar3;
    }
    local_98._4_4_ = ~-(uint)(fVar3 < 0.0) & local_98._4_4_;
    bVar1 = isLinearRangeValid(local_40,&local_58,&local_68,(Vec2 *)local_98,local_38);
    iVar2 = c + 1;
  } while (!bVar1);
  return c <= (int)fVar4;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const float							coordX,
								const int							coordY,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(), coordX, prec.coordBits.x(), prec.uvwBits.x());

	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);

	const int					w				= level.getWidth();

	const TextureFormat			format			= level.getFormat();
	const TextureChannelClass	texClass		= getTextureChannelClass(format.type);

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);
	DE_UNREF(texClass);
	DE_UNREF(format);

	for (int i = minI; i <= maxI; i++)
	{
		// Wrapped coordinates
		const int	x0		= wrap(sampler.wrapS, i  , w);
		const int	x1		= wrap(sampler.wrapS, i+1, w);

		// Bounds for filtering factors
		const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
		const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);

		const Vec4	colorA	= lookup<float>(level, sampler, x0, coordY, 0);
		const Vec4	colorB	= lookup<float>(level, sampler, x1, coordY, 0);

		if (isLinearRangeValid(prec, colorA, colorB, Vec2(minA, maxA), result))
			return true;
	}

	return false;
}